

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::array<float,4ul>>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  array<float,_4UL> value;
  array<float,_4UL> value_1;
  array<float,_4UL> local_60;
  string local_50;
  
  paVar2 = (result->
           super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)
      ._M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,4ul>(this,&local_60);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>::
        _M_realloc_insert<std::array<float,4ul>const&>
                  ((vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>> *)result,
                   iVar3,&local_60);
      }
      else {
        *(ulong *)(iVar3._M_current)->_M_elems =
             CONCAT71(local_60._M_elems._1_7_,local_60._M_elems[0]._0_1_);
        *(undefined8 *)((iVar3._M_current)->_M_elems + 2) = local_60._M_elems._8_8_;
        ppaVar1 = &(result->
                   super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003df008;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_60);
        if (!bVar5) {
          return false;
        }
        if (local_60._M_elems[0]._0_1_ == sep) {
          bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = LookChar1(this,(char *)&local_50);
          if (!bVar5) {
            return false;
          }
          iVar6 = 3;
          if ((char)local_50._M_dataplus._M_p != end_symbol) goto LAB_003def88;
        }
        else {
LAB_003def88:
          if (local_60._M_elems[0]._0_1_ != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar7 = pSVar4->idx_ - 1, uVar7 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar7;
            }
            goto LAB_003df008;
          }
          bVar5 = SkipWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)&local_50);
          iVar6 = 3;
          if (bVar5) {
            iVar3._M_current =
                 (result->
                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>::
              _M_realloc_insert<std::array<float,4ul>const&>
                        ((vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>> *)
                         result,iVar3,(array<float,_4UL> *)&local_50);
            }
            else {
              *(pointer *)(iVar3._M_current)->_M_elems = local_50._M_dataplus._M_p;
              *(size_type *)((iVar3._M_current)->_M_elems + 2) = local_50._M_string_length;
              ppaVar1 = &(result->
                         super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            iVar6 = 0;
          }
        }
      } while (iVar6 == 0);
      if (iVar6 == 1) {
        return false;
      }
LAB_003df008:
      if ((result->
          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar9 = "Empty array.\n";
      pcVar8 = "";
    }
    else {
      pcVar9 = "Not starting with the value of requested type.\n";
      pcVar8 = "";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar9,pcVar8);
    PushError(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}